

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O0

bool __thiscall
CppJieba::MPSegment::_calcDAG
          (MPSegment *this,const_iterator begin,const_iterator end,SegmentContext *segContext)

{
  TrieNodeInfo *pTVar1;
  bool bVar2;
  char *pcVar3;
  difference_type dVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  mapped_type *ppTVar8;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_false> this_00;
  Trie *in_RCX;
  const_iterator in_RDX;
  unsigned_short *in_RSI;
  const_iterator in_RDI;
  uint nextp;
  uint j;
  int i;
  SegmentChar *back;
  const_iterator it;
  vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
  vp;
  undefined6 in_stack_fffffffffffffe78;
  uint16_t in_stack_fffffffffffffe7e;
  SegmentChar *in_stack_fffffffffffffe80;
  vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
  *in_stack_fffffffffffffe90;
  char *local_128;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_false>
  local_108;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_false>
  local_100;
  int local_f8;
  uint local_f4;
  unsigned_short *local_e8;
  int local_dc;
  reference local_d8;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_80 [3];
  string local_48 [24];
  vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
  *in_stack_ffffffffffffffd0;
  bool local_1;
  
  bVar2 = __gnu_cxx::operator>=
                    ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      *)in_stack_fffffffffffffe80,
                     (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
  if (bVar2) {
    pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                     ,0x2f);
    if (pcVar3 == (char *)0x0) {
      local_128 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp";
    }
    else {
      local_128 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                          ,0x2f);
      local_128 = local_128 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"begin >= end.",(allocator *)&stack0xffffffffffffffb7);
    Limonp::Logger::LoggingF(3,local_128,0x92,(string *)local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    local_1 = false;
  }
  else {
    std::
    vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
    ::vector((vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
              *)0x139277);
    local_80[0]._M_current = in_RSI;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)in_stack_fffffffffffffe80,
                              (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
          bVar2) {
      __gnu_cxx::
      __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator*(local_80);
      SegmentChar::SegmentChar(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7e);
      std::vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>::push_back
                ((vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_> *)
                 in_stack_fffffffffffffe80,
                 (value_type *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
      SegmentChar::~SegmentChar((SegmentChar *)0x1392f2);
      local_d8 = std::vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>::back
                           ((vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_> *
                            )in_stack_fffffffffffffe80);
      dVar4 = __gnu_cxx::operator-
                        ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                          *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
      local_dc = (int)dVar4;
      std::
      vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
      ::clear((vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
               *)0x139335);
      local_e8 = local_80[0]._M_current;
      bVar2 = Trie::find(in_RCX,in_RDX,in_RDI,in_stack_ffffffffffffffd0);
      if (bVar2) {
        for (local_f4 = 0; uVar5 = (ulong)local_f4,
            sVar6 = std::
                    vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                    ::size((vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                            *)(local_80 + 1)), uVar5 < sVar6; local_f4 = local_f4 + 1) {
          in_stack_fffffffffffffe90 =
               (vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                *)(local_80 + 1);
          pvVar7 = std::
                   vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                   ::operator[](in_stack_fffffffffffffe90,(ulong)local_f4);
          local_f8 = pvVar7->first + local_dc;
          pvVar7 = std::
                   vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                   ::operator[](in_stack_fffffffffffffe90,(ulong)local_f4);
          pTVar1 = pvVar7->second;
          ppTVar8 = std::
                    unordered_map<unsigned_int,_const_CppJieba::TrieNodeInfo_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                    ::operator[]((unordered_map<unsigned_int,_const_CppJieba::TrieNodeInfo_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                                  *)in_stack_fffffffffffffe80,
                                 (key_type *)
                                 CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
          *ppTVar8 = pTVar1;
        }
      }
      local_100._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_const_CppJieba::TrieNodeInfo_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
           ::end((unordered_map<unsigned_int,_const_CppJieba::TrieNodeInfo_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                  *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
      this_00._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_const_CppJieba::TrieNodeInfo_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
           ::find((unordered_map<unsigned_int,_const_CppJieba::TrieNodeInfo_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                   *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78),
                  (key_type *)0x1394c7);
      local_108._M_cur = this_00._M_cur;
      bVar2 = std::__detail::operator==(&local_100,&local_108);
      if (bVar2) {
        in_stack_fffffffffffffe80 =
             (SegmentChar *)
             std::
             unordered_map<unsigned_int,_const_CppJieba::TrieNodeInfo_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
             ::operator[]((unordered_map<unsigned_int,_const_CppJieba::TrieNodeInfo_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                           *)in_stack_fffffffffffffe80,
                          (key_type *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78))
        ;
        *(unsigned_short **)in_stack_fffffffffffffe80 = (unsigned_short *)0x0;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                    *)this_00._M_cur,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
    }
    local_1 = true;
    std::
    vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
    ::~vector(in_stack_fffffffffffffe90);
  }
  return local_1;
}

Assistant:

bool _calcDAG(Unicode::const_iterator begin, Unicode::const_iterator end, SegmentContext& segContext) const
            {
                if(begin >= end)
                {
                    LogError("begin >= end.");
                    return false;
                }

                vector<pair<uint, const TrieNodeInfo*> > vp;
                for(Unicode::const_iterator it = begin; it != end; it++)
                {
                    segContext.push_back(SegmentChar(*it));
                    SegmentChar& back = segContext.back();
                    int i = it - begin;
                    vp.clear();
                    if(_trie.find(it, end, vp))
                    {
                        for(uint j = 0; j < vp.size(); j++)
                        {
                            uint nextp = vp[j].first + i;
                            back.dag[nextp] = vp[j].second; 
                        }
                    }
                    if(back.dag.end() == back.dag.find(i))
                    {
                        back.dag[i] = NULL;
                    }
                }
                return true;
            }